

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_CreateSubscription
               (UA_Server *server,UA_Session *session,UA_CreateSubscriptionRequest *request,
               UA_CreateSubscriptionResponse *response)

{
  UA_Subscription *pUVar1;
  UA_UInt32 UVar2;
  UA_Subscription *subscription;
  long lVar3;
  
  subscription = UA_Subscription_new(session,response->subscriptionId);
  if (subscription == (UA_Subscription *)0x0) {
    UVar2 = 0x80030000;
    lVar3 = 0xc;
  }
  else {
    UVar2 = session->lastSubscriptionID + 1;
    session->lastSubscriptionID = UVar2;
    subscription->subscriptionID = UVar2;
    pUVar1 = (session->serverSubscriptions).lh_first;
    (subscription->listEntry).le_next = pUVar1;
    if (pUVar1 != (UA_Subscription *)0x0) {
      (pUVar1->listEntry).le_prev = (UA_Subscription **)subscription;
    }
    (session->serverSubscriptions).lh_first = subscription;
    (subscription->listEntry).le_prev = &(session->serverSubscriptions).lh_first;
    subscription->publishingEnabled = request->publishingEnabled;
    setSubscriptionSettings
              (server,subscription,request->requestedPublishingInterval,
               request->requestedLifetimeCount,request->requestedMaxKeepAliveCount,
               request->maxNotificationsPerPublish,request->priority);
    UVar2 = subscription->maxKeepAliveCount;
    subscription->currentKeepAliveCount = UVar2;
    response->subscriptionId = subscription->subscriptionID;
    response->revisedPublishingInterval = subscription->publishingInterval;
    response->revisedLifetimeCount = subscription->lifeTimeCount;
    lVar3 = 0x9c;
  }
  *(UA_UInt32 *)((long)&(response->responseHeader).timestamp + lVar3) = UVar2;
  return;
}

Assistant:

void
Service_CreateSubscription(UA_Server *server, UA_Session *session,
                           const UA_CreateSubscriptionRequest *request,
                           UA_CreateSubscriptionResponse *response) {
    /* Create the subscription */
    UA_Subscription *newSubscription = UA_Subscription_new(session, response->subscriptionId);
    if(!newSubscription) {
        UA_LOG_DEBUG_SESSION(server->config.logger, session,
                             "Processing CreateSubscriptionRequest failed");
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    newSubscription->subscriptionID = UA_Session_getUniqueSubscriptionID(session);
    UA_Session_addSubscription(session, newSubscription);

    /* Set the subscription parameters */
    newSubscription->publishingEnabled = request->publishingEnabled;
    setSubscriptionSettings(server, newSubscription, request->requestedPublishingInterval,
                            request->requestedLifetimeCount, request->requestedMaxKeepAliveCount,
                            request->maxNotificationsPerPublish, request->priority);
    newSubscription->currentKeepAliveCount = newSubscription->maxKeepAliveCount; /* set settings first */

    /* Prepare the response */
    response->subscriptionId = newSubscription->subscriptionID;
    response->revisedPublishingInterval = newSubscription->publishingInterval;
    response->revisedLifetimeCount = newSubscription->lifeTimeCount;
    response->revisedMaxKeepAliveCount = newSubscription->maxKeepAliveCount;

    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "CreateSubscriptionRequest: Created Subscription %u "
                         "with a publishing interval of %f ms", response->subscriptionId,
                         newSubscription->publishingInterval);
}